

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_cHRM_fixed(png_structrp png_ptr,png_xy *xy)

{
  png_byte buf [32];
  
  png_save_int_32(buf,xy->whitex);
  png_save_int_32(buf + 4,xy->whitey);
  png_save_int_32(buf + 8,xy->redx);
  png_save_int_32(buf + 0xc,xy->redy);
  png_save_int_32(buf + 0x10,xy->greenx);
  png_save_int_32(buf + 0x14,xy->greeny);
  png_save_int_32(buf + 0x18,xy->bluex);
  png_save_int_32(buf + 0x1c,xy->bluey);
  png_write_complete_chunk(png_ptr,0x6348524d,buf,0x20);
  return;
}

Assistant:

void /* PRIVATE */
png_write_cHRM_fixed(png_structrp png_ptr, const png_xy *xy)
{
   png_byte buf[32];

   png_debug(1, "in png_write_cHRM");

   /* Each value is saved in 1/100,000ths */
   png_save_int_32(buf,      xy->whitex);
   png_save_int_32(buf +  4, xy->whitey);

   png_save_int_32(buf +  8, xy->redx);
   png_save_int_32(buf + 12, xy->redy);

   png_save_int_32(buf + 16, xy->greenx);
   png_save_int_32(buf + 20, xy->greeny);

   png_save_int_32(buf + 24, xy->bluex);
   png_save_int_32(buf + 28, xy->bluey);

   png_write_complete_chunk(png_ptr, png_cHRM, buf, 32);
}